

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_io.cc
# Opt level: O1

void __thiscall
gimage::PNGImageIO::loadHeader(PNGImageIO *this,char *name,long *width,long *height,int *depth)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  __jmp_buf_tag *__env;
  size_type *psVar4;
  IOException *pIVar5;
  long *plVar6;
  png_structp png;
  png_infop info;
  png_infop end;
  long local_b0;
  long local_a8;
  allocator local_99;
  string local_98;
  long local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar2 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar2 == '\0') {
    pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_70,name,(allocator *)&local_b0);
    std::operator+(&local_50,"Can only load PNG image (",&local_70);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_98._M_dataplus._M_p = (pointer)*plVar6;
    psVar4 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_98._M_dataplus._M_p == psVar4) {
      local_98.field_2._M_allocated_capacity = *psVar4;
      local_98.field_2._8_8_ = plVar6[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar4;
    }
    local_98._M_string_length = plVar6[1];
    *plVar6 = (long)psVar4;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    gutil::IOException::IOException(pIVar5,&local_98);
    __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  __stream = fopen(name,"rb");
  if (__stream == (FILE *)0x0) {
    pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_70,name,(allocator *)&local_b0);
    std::operator+(&local_50,"Cannot open file (",&local_70);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_98._M_dataplus._M_p = (pointer)*plVar6;
    psVar4 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_98._M_dataplus._M_p == psVar4) {
      local_98.field_2._M_allocated_capacity = *psVar4;
      local_98.field_2._8_8_ = plVar6[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar4;
    }
    local_98._M_string_length = plVar6[1];
    *plVar6 = (long)psVar4;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    gutil::IOException::IOException(pIVar5,&local_98);
    __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_b0 = png_create_read_struct("1.6.37",0,0);
  if (local_b0 == 0) {
    fclose(__stream);
    pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Cannot allocate handle for reading PNG files","");
    gutil::IOException::IOException(pIVar5,&local_98);
    __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_a8 = png_create_info_struct(local_b0);
  if (local_a8 != 0) {
    local_78 = png_create_info_struct(local_b0);
    if (local_78 == 0) {
      png_destroy_read_struct(&local_b0,&local_a8,0);
      fclose(__stream);
      pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Cannot allocate PNG info structure","");
      gutil::IOException::IOException(pIVar5,&local_98);
      __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_b0,longjmp,200);
    iVar2 = _setjmp(__env);
    if (iVar2 == 0) {
      png_init_io(local_b0,__stream);
      png_read_info(local_b0,local_a8);
      uVar3 = png_get_image_width(local_b0,local_a8);
      *width = (ulong)uVar3;
      uVar3 = png_get_image_height(local_b0,local_a8);
      *height = (ulong)uVar3;
      *depth = 1;
      bVar1 = png_get_color_type(local_b0,local_a8);
      if ((bVar1 < 7) && ((0x4cU >> (bVar1 & 0x1f) & 1) != 0)) {
        *depth = 3;
      }
      png_destroy_read_struct(&local_b0,&local_a8,&local_78);
      fclose(__stream);
      return;
    }
    png_destroy_read_struct(&local_b0,&local_a8,&local_78);
    fclose(__stream);
    pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_70,name,&local_99);
    std::operator+(&local_50,"Cannot read PNG file (",&local_70);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_98._M_dataplus._M_p = (pointer)*plVar6;
    psVar4 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_98._M_dataplus._M_p == psVar4) {
      local_98.field_2._M_allocated_capacity = *psVar4;
      local_98.field_2._8_8_ = plVar6[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar4;
    }
    local_98._M_string_length = plVar6[1];
    *plVar6 = (long)psVar4;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    gutil::IOException::IOException(pIVar5,&local_98);
    __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  png_destroy_read_struct(&local_b0,0);
  fclose(__stream);
  pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"Cannot allocate PNG info structure","");
  gutil::IOException::IOException(pIVar5,&local_98);
  __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void PNGImageIO::loadHeader(const char *name, long &width, long &height,
                            int &depth) const
{
  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNG image ("+std::string(name)+")");
  }

  // initialize reading a png file

  FILE *in=fopen(name, "rb");

  if (in == 0)
  {
    throw gutil::IOException("Cannot open file ("+std::string(name)+")");
  }

  png_structp png=png_create_read_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);

  if (png == 0)
  {
    fclose(in);
    throw gutil::IOException("Cannot allocate handle for reading PNG files");
  }

  png_infop info=png_create_info_struct(png);

  if (info == 0)
  {
    png_destroy_read_struct(&png, static_cast<png_infopp>(0), static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  png_infop end=png_create_info_struct(png);

  if (end == 0)
  {
    png_destroy_read_struct(&png, &info, static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  if (setjmp(png_jmpbuf(png)))
  {
    png_destroy_read_struct(&png, &info, &end);
    fclose(in);
    throw gutil::IOException("Cannot read PNG file ("+std::string(name)+")");
  }

  // read header data

  png_init_io(png, in);
  png_read_info(png, info);

  width=static_cast<long>(png_get_image_width(png, info));
  height=static_cast<long>(png_get_image_height(png, info));

  depth=1;
  int color=png_get_color_type(png, info);

  if (color == PNG_COLOR_TYPE_PALETTE || color == PNG_COLOR_TYPE_RGB ||
      color == PNG_COLOR_TYPE_RGB_ALPHA)
  {
    depth=3;
  }

  // close data set

  png_destroy_read_struct(&png, &info, &end);
  fclose(in);
}